

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O3

bool Kernel::SortHelper::allTopLevelArgsAreSorts(AtomicSort *sort)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = *(uint *)&(sort->super_Term).field_0xc & 0xfffffff;
  uVar3 = (ulong)uVar2;
  if (uVar2 == 0) {
    bVar5 = true;
  }
  else {
    uVar4 = 1;
    bVar5 = false;
    do {
      uVar1 = (sort->super_Term)._args[uVar3]._content;
      if (((uVar1 & 1) == 0) && ((*(byte *)(uVar1 + 0x28) & 0x20) == 0)) {
        return bVar5;
      }
      bVar5 = uVar2 <= uVar4;
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return bVar5;
}

Assistant:

bool SortHelper::allTopLevelArgsAreSorts(AtomicSort* sort)
{
  for(unsigned i = 0; i < sort->arity(); i++){
    TermList arg = *sort->nthArgument(i);
    if(arg.isVar()){
      continue;
    }
    if(!arg.term()->isSort()){
      return false;
    }
  }
  return true;
}